

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O0

bool lsim::load_logisim(LSimContext *lsim_context,char *data,size_t len)

{
  bool bVar1;
  undefined1 local_290 [8];
  LogisimParser parser;
  undefined1 local_110 [8];
  xml_parse_result result;
  xml_document xml_doc;
  size_t len_local;
  char *data_local;
  LSimContext *lsim_context_local;
  
  pugi::xml_document::xml_document((xml_document *)&result.encoding);
  pugi::xml_document::load_buffer
            ((xml_parse_result *)local_110,(xml_document *)&result.encoding,data,len,0x74,
             encoding_auto);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool((xml_parse_result *)local_110);
  if (bVar1) {
    anon_unknown.dwarf_18860d::LogisimParser::LogisimParser
              ((LogisimParser *)local_290,(xml_document *)&result.encoding,lsim_context);
    lsim_context_local._7_1_ =
         anon_unknown.dwarf_18860d::LogisimParser::parse_xml((LogisimParser *)local_290);
    parser.m_context.m_tunnels._M_h._M_single_bucket._0_4_ = 1;
    anon_unknown.dwarf_18860d::LogisimParser::~LogisimParser((LogisimParser *)local_290);
  }
  else {
    lsim_context_local._7_1_ = false;
    parser.m_context.m_tunnels._M_h._M_single_bucket._0_4_ = 1;
  }
  pugi::xml_document::~xml_document((xml_document *)&result.encoding);
  return lsim_context_local._7_1_;
}

Assistant:

bool load_logisim(LSimContext *lsim_context, const char *data, size_t len) {
    pugi::xml_document xml_doc;

    auto result = xml_doc.load_buffer(data, len);
    if (!result) {
        return false;
    }

    auto parser = LogisimParser(&xml_doc, lsim_context);
    return parser.parse_xml();
}